

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall QSocks5SocketEngine::connectInternal(QSocks5SocketEngine *this)

{
  QLatin1StringView latin1;
  byte bVar1;
  quint16 qVar2;
  SocketType SVar3;
  QSocks5SocketEnginePrivate *pQVar4;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QSocks5SocketEnginePrivate *d;
  undefined4 in_stack_ffffffffffffff58;
  SocketState in_stack_ffffffffffffff5c;
  QAbstractSocketEngine *in_stack_ffffffffffffff60;
  QTcpSocket *pQVar5;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  QMessageLogger *pQVar6;
  undefined4 in_stack_ffffffffffffff98;
  bool bVar7;
  undefined4 in_stack_ffffffffffffff9c;
  undefined1 local_60 [24];
  char local_48 [20];
  Socks5Mode in_stack_ffffffffffffffcc;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffffd0;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  pQVar4 = d_func((QSocks5SocketEngine *)0x3727f0);
  if (pQVar4->data == (QSocks5Data *)0x0) {
    SVar3 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)0x372812);
    if (SVar3 == TcpSocket) {
      QSocks5SocketEnginePrivate::initialize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
    else {
      SVar3 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)0x372835);
      if (SVar3 == UdpSocket) {
        QSocks5SocketEnginePrivate::initialize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT17(in_stack_ffffffffffffff6f,
                                    CONCAT16(in_stack_ffffffffffffff6e,
                                             CONCAT24(in_stack_ffffffffffffff6c,
                                                      in_stack_ffffffffffffff68))),
                   (size_t)in_stack_ffffffffffffff60);
        latin1.m_data._0_4_ = in_stack_ffffffffffffff98;
        latin1.m_size = (qsizetype)pQVar6;
        latin1.m_data._4_4_ = in_stack_ffffffffffffff9c;
        QString::QString((QString *)in_RDI,latin1);
        QHostAddress::QHostAddress
                  ((QHostAddress *)in_RDI,
                   (QString *)
                   CONCAT17(in_stack_ffffffffffffff6f,
                            CONCAT16(in_stack_ffffffffffffff6e,
                                     CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)))
                  );
        bVar1 = (**(code **)(*(long *)&in_RDI->context + 0x90))(in_RDI,local_10,0);
        bVar1 = bVar1 ^ 0xff;
        QHostAddress::~QHostAddress((QHostAddress *)0x3728bf);
        QString::~QString((QString *)0x3728cc);
        if ((bVar1 & 1) == 0) {
          QAbstractSocketEngine::setState(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          bVar7 = true;
        }
        else {
          bVar7 = false;
        }
        goto LAB_003729fe;
      }
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff6f,
                                         CONCAT16(in_stack_ffffffffffffff6e,
                                                  CONCAT24(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68))),
                 (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QMessageLogger::fatal(local_48,"QSocks5SocketEngine::connectToHost: in QTcpServer mode");
    }
  }
  if ((pQVar4->super_QAbstractSocketEnginePrivate).socketState != ConnectingState) {
    if ((pQVar4->socks5State == Uninitialized) || (pQVar4->socks5State == AuthenticatingError)) {
      QAbstractSocketEngine::setState(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      pQVar5 = pQVar4->data->controlSocket;
      (**(code **)(*(long *)&pQVar5->super_QAbstractSocket + 0x108))(pQVar5,0x10000);
    }
    pQVar5 = pQVar4->data->controlSocket;
    QNetworkProxy::hostName
              ((QNetworkProxy *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,
                                 CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))));
    qVar2 = QNetworkProxy::port((QNetworkProxy *)pQVar5);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)pQVar5,in_stack_ffffffffffffff5c);
    (**(code **)(*(long *)&pQVar5->super_QAbstractSocket + 0xf8))
              (pQVar5,local_60,qVar2,in_stack_ffffffffffffff9c,2);
    QString::~QString((QString *)0x3729f9);
  }
  bVar7 = false;
LAB_003729fe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QSocks5SocketEngine::connectInternal()
{
    Q_D(QSocks5SocketEngine);

    if (!d->data) {
        if (socketType() == QAbstractSocket::TcpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::ConnectMode);
#ifndef QT_NO_UDPSOCKET
        } else if (socketType() == QAbstractSocket::UdpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
            // all udp needs to be bound
            if (!bind(QHostAddress("0.0.0.0"_L1), 0))
                return false;

            setState(QAbstractSocket::ConnectedState);
            return true;
#endif
        } else {
            qFatal("QSocks5SocketEngine::connectToHost: in QTcpServer mode");
            return false;
        }
    }

    if (d->socketState != QAbstractSocket::ConnectingState) {
        if (d->socks5State == QSocks5SocketEnginePrivate::Uninitialized
            // We may have new auth credentials since an earlier failure:
         || d->socks5State == QSocks5SocketEnginePrivate::AuthenticatingError) {
            setState(QAbstractSocket::ConnectingState);
            //limit buffer in internal socket, data is buffered in the external socket under application control
            d->data->controlSocket->setReadBufferSize(65536);
        }

        d->data->controlSocket->connectToHost(d->proxyInfo.hostName(), d->proxyInfo.port());
    }

    return false;
}